

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O1

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
::
SafeReleaseDeviceObject<std::vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>>>,void>
          (RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
           *this,vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
                 *Object,Uint64 QueueMask)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  char (*Args_1) [27];
  ulong uVar5;
  string msg;
  DynamicStaleResourceWrapper Wrapper;
  string local_58;
  DynamicStaleResourceWrapper local_38;
  
  if (*(long *)(this + 0x1c48) == 0) {
    FormatString<char[99]>
              (&local_58,
               (char (*) [99])
               "Command queues have been destroyed. Are you releasing an object from the render device destructor?"
              );
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  uVar5 = ~(-1L << ((byte)*(ulong *)(this + 0x1c40) & 0x3f));
  if (0x3f < *(ulong *)(this + 0x1c40)) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar5 = uVar5 & QueueMask;
  if (uVar5 == 0) {
    FormatString<char[57]>
              (&local_58,(char (*) [57])"At least one bit should be set in the command queue mask");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x6f);
  }
  else {
    uVar4 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
    Args_1 = (char (*) [27])((uVar4 >> 4) + uVar4);
    uVar4 = ((ulong)Args_1 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    DynamicStaleResourceWrapper::
    Create<std::vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>>>,void>
              (&local_38,Object,uVar4);
    do {
      uVar2 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (*(ulong *)(this + 0x1c40) <= uVar2) {
        FormatString<char[26],char[27]>
                  (&local_58,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x80c319,Args_1
                  );
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"SafeReleaseDeviceObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
                   ,0x7a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      lVar1 = *(long *)(this + 0x1c48) + uVar2 * 0x168;
      ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::SafeReleaseResource
                ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)(lVar1 + 0x38),
                 &local_38,*(Uint64 *)(lVar1 + 0x28));
      Args_1 = (char (*) [27])(uVar2 & 0xffffffff);
      bVar3 = (byte)Args_1 & 0x3f;
      uVar4 = uVar4 - 1;
      uVar5 = uVar5 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    } while (uVar5 != 0);
    if (uVar4 == 0) {
      return;
    }
    FormatString<char[26],char[19]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumReferences == 0",(char (*) [19])Args_1);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"SafeReleaseDeviceObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x82);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SafeReleaseDeviceObject(ObjectType&& Object, Uint64 QueueMask)
    {
        VERIFY(m_CommandQueues != nullptr, "Command queues have been destroyed. Are you releasing an object from the render device destructor?");

        QueueMask &= GetCommandQueueMask();

        VERIFY(QueueMask != 0, "At least one bit should be set in the command queue mask");
        if (QueueMask == 0)
            return;

        DynamicStaleResourceWrapper::RefCounterType NumReferences = PlatformMisc::CountOneBits(QueueMask);

        auto Wrapper = DynamicStaleResourceWrapper::Create(std::move(Object), NumReferences);

        while (QueueMask != 0)
        {
            auto QueueInd = PlatformMisc::GetLSB(QueueMask);
            VERIFY_EXPR(QueueInd < m_CmdQueueCount);

            auto& Queue = m_CommandQueues[QueueInd];
            // Do not use std::move on wrapper!!!
            Queue.ReleaseQueue.SafeReleaseResource(Wrapper, Queue.NextCmdBufferNumber.load());
            QueueMask &= ~(Uint64{1} << Uint64{QueueInd});
            --NumReferences;
        }
        VERIFY_EXPR(NumReferences == 0);

        Wrapper.GiveUpOwnership();
    }